

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenterCmd.cpp
# Opt level: O0

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  char *pcVar1;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined8 in_stack_00000038;
  char in_stack_00000040;
  char *in_stack_00000048;
  char **string_field;
  int found;
  char *val;
  char *stop_char;
  char *in_stack_ffffffffffffff58;
  char *local_a0;
  char *local_80;
  long local_48;
  int local_4;
  
  if (((in_stack_00000030 == 0) && (in_RCX != (int *)0x0)) &&
     ((*in_RCX != 0 || ((in_stack_00000018 != 0 && (*in_RDX != 0)))))) {
    if (in_stack_00000040 == '-') {
      if (in_stack_00000048 == (char *)0x0) {
        local_a0 = "";
      }
      else {
        local_a0 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' option given more than once%s\n",package_name,in_stack_00000038,
              local_a0);
    }
    else {
      if (in_stack_00000048 == (char *)0x0) {
        local_80 = "";
      }
      else {
        local_80 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
              in_stack_00000038,(ulong)(uint)(int)in_stack_00000040,local_80);
    }
    local_4 = 1;
  }
  else if ((in_RDX == (int *)0x0) || ((*in_RDX == 0 || (in_stack_00000020 != 0)))) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = *in_RCX + 1;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = *in_RDX + 1;
    }
    local_48 = in_R8;
    if (in_R9 != (long *)0x0) {
      local_48 = *in_R9;
    }
    if ((in_stack_00000010 == 1) && (local_48 != 0)) {
      if ((in_stack_00000028 == 0) && (*in_RDI != 0)) {
        free((void *)*in_RDI);
      }
      pcVar1 = gengetopt_strdup(in_stack_ffffffffffffff58);
      *in_RDI = (long)pcVar1;
    }
    if (((in_stack_00000010 != 0) && (in_R8 != 0)) && (in_RSI != (long *)0x0)) {
      if (in_stack_00000028 == 0) {
        if (*in_RSI != 0) {
          free((void *)*in_RSI);
        }
        pcVar1 = gengetopt_strdup(in_stack_ffffffffffffff58);
        *in_RSI = (long)pcVar1;
      }
      else {
        *in_RSI = in_R8;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);
  FIX_UNUSED (stop_char);

  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  FIX_UNUSED (default_value);
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };


  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}